

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O3

void labpack_write_utf8(labpack_writer_t *writer,char *value,uint32_t length)

{
  mpack_error_t error;
  char *pcVar1;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x1a7,"void labpack_write_utf8(labpack_writer_t *, const char *, uint32_t)");
  }
  if (writer->status == LABPACK_STATUS_OK) {
    if (length == 0 || value != (char *)0x0) {
      mpack_write_utf8(writer->encoder,value,length);
      error = writer->encoder->error;
      if (error == mpack_ok) {
        return;
      }
      writer->status = LABPACK_STATUS_ERROR_ENCODER;
      pcVar1 = labpack_mpack_error_message(error);
    }
    else {
      writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
      pcVar1 = "The string value cannot be NULL while the length is greater than zero (0)";
    }
    writer->status_message = pcVar1;
  }
  return;
}

Assistant:

void
labpack_write_utf8(labpack_writer_t* writer, const char* value, uint32_t length)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!value && length > 0) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = NULL_STRING_MESSAGE;
            return;
        }
        mpack_write_utf8(writer->encoder, value, length);
        labpack_writer_check_encoder(writer);
    }
}